

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eccommit_impl.h
# Opt level: O2

int secp256k1_ec_commit_tweak
              (uchar *tweak32,secp256k1_ge *pubp,secp256k1_sha256 *sha,uchar *data,size_t data_size)

{
  int iVar1;
  int iVar2;
  uchar rbuf [33];
  
  iVar1 = secp256k1_ge_is_infinity(pubp);
  if (iVar1 == 0) {
    secp256k1_fe_normalize(&pubp->x);
    secp256k1_fe_normalize(&pubp->y);
    secp256k1_fe_get_b32(rbuf + 1,&pubp->x);
    iVar2 = secp256k1_fe_is_odd(&pubp->y);
    rbuf[0] = iVar2 == 0 ^ 3;
    secp256k1_sha256_write(sha,rbuf,0x21);
    secp256k1_sha256_write(sha,data,data_size);
    secp256k1_sha256_finalize(sha,tweak32);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static int secp256k1_ec_commit_tweak(unsigned char *tweak32, secp256k1_ge* pubp, secp256k1_sha256* sha, const unsigned char *data, size_t data_size)
{
    unsigned char rbuf[33];

    if (!secp256k1_ec_commit_pubkey_serialize_const(pubp, rbuf)) {
        return 0;
    }
    secp256k1_sha256_write(sha, rbuf, sizeof(rbuf));
    secp256k1_sha256_write(sha, data, data_size);
    secp256k1_sha256_finalize(sha, tweak32);
    return 1;
}